

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall EventLoop::runInLoop(EventLoop *this,Functor *cb)

{
  int iVar1;
  EventLoop *this_00;
  long in_FS_OFFSET;
  
  iVar1 = this->threadId_;
  this_00 = this;
  if (*(int *)(in_FS_OFFSET + -0x30) == 0) {
    CurrentThread::cacheTid();
  }
  if (iVar1 != *(int *)(in_FS_OFFSET + -0x30)) {
    queueInLoop(this,cb);
    return;
  }
  if ((cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*cb->_M_invoker)((_Any_data *)cb);
    return;
  }
  std::__throw_bad_function_call();
  pthread_mutex_lock((pthread_mutex_t *)&this_00->mutex_);
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
             &this_00->pendingFunctors_,cb);
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->mutex_);
  iVar1 = this_00->threadId_;
  if (*(int *)(in_FS_OFFSET + -0x30) == 0) {
    CurrentThread::cacheTid();
  }
  if ((iVar1 == *(int *)(in_FS_OFFSET + -0x30)) && (this_00->callingPendingFunctors_ != true)) {
    return;
  }
  wakeup(this_00);
  return;
}

Assistant:

void EventLoop::runInLoop(Functor&& cb){
    if(isInLoopThread()){
        cb();
    }else{
        queueInLoop(std::move(cb));
    }
}